

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O3

bool __thiscall google::protobuf::safe_strtod(protobuf *this,StringPiece str,double *value)

{
  bool bVar1;
  char *local_38;
  undefined8 local_30;
  char local_28 [16];
  
  local_38 = local_28;
  if (this == (protobuf *)0x0) {
    local_30 = 0;
    local_28[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,this,str.ptr_ + (long)this);
  }
  bVar1 = safe_strtod(local_38,(double *)str.length_);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return bVar1;
}

Assistant:

inline bool safe_strtod(StringPiece str, double* value) {
  return safe_strtod(str.ToString(), value);
}